

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<ProString>,_ProString> __thiscall
QList<ProString>::operator==(QList<ProString> *this,QList<ProString> *other)

{
  long lVar1;
  bool bVar2;
  ProString *this_00;
  ProString *other_00;
  long lVar3;
  
  lVar3 = (this->d).size;
  lVar1 = (other->d).size;
  if (lVar3 == lVar1) {
    this_00 = (this->d).ptr;
    other_00 = (other->d).ptr;
    if (this_00 == other_00) {
      return true;
    }
    if (lVar3 == lVar1) {
      if (lVar3 == 0) {
        return lVar3 == 0;
      }
      bVar2 = ProString::operator==(this_00,other_00);
      if (bVar2) {
        lVar3 = lVar3 * 0x30;
        do {
          lVar3 = lVar3 + -0x30;
          other_00 = other_00 + 1;
          this_00 = this_00 + 1;
          if (lVar3 == 0) {
            return lVar3 == 0;
          }
          bVar2 = ProString::operator==(this_00,other_00);
        } while (bVar2);
        return false;
      }
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }